

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O1

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::vertex_split
          (TriConnectivity *this,VertexHandle v0,VertexHandle v1,VertexHandle vl,VertexHandle vr)

{
  HalfedgeHandle _hh;
  BaseHandle BVar1;
  BaseHandle _hh_00;
  Vertex *pVVar2;
  Halfedge *pHVar3;
  
  _hh_00.idx_ = -1;
  BVar1.idx_ = -1;
  if (vl.super_BaseHandle.idx_ != -1) {
    _hh = PolyConnectivity::find_halfedge(&this->super_PolyConnectivity,v1,vl);
    if (_hh.super_BaseHandle.idx_ == -1) {
      __assert_fail("v1vl.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xbb,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    BVar1.idx_ = (int)insert_loop(this,_hh);
  }
  if (vr.super_BaseHandle.idx_ != -1) {
    _hh_00.idx_ = (int)PolyConnectivity::find_halfedge(&this->super_PolyConnectivity,vr,v1);
    if (_hh_00.idx_ == -1) {
      __assert_fail("vrv1.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xc3,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    insert_loop(this,(HalfedgeHandle)_hh_00.idx_);
  }
  if (vl.super_BaseHandle.idx_ == -1) {
    pVVar2 = ArrayKernel::vertex((ArrayKernel *)this,v1);
    pHVar3 = ArrayKernel::halfedge
                       ((ArrayKernel *)this,
                        (HalfedgeHandle)(pVVar2->halfedge_handle_).super_BaseHandle.idx_);
    BVar1.idx_ = (pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  }
  if (vr.super_BaseHandle.idx_ == -1) {
    pVVar2 = ArrayKernel::vertex((ArrayKernel *)this,v1);
    pHVar3 = ArrayKernel::halfedge
                       ((ArrayKernel *)this,
                        (HalfedgeHandle)(pVVar2->halfedge_handle_).super_BaseHandle.idx_);
    _hh_00.idx_ = (pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  }
  BVar1.idx_ = (int)insert_edge(this,v0,BVar1.idx_,_hh_00.idx_);
  return (BaseHandle)(BaseHandle)BVar1.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::vertex_split(VertexHandle v0, VertexHandle v1,
                              VertexHandle vl, VertexHandle vr)
{
  HalfedgeHandle v1vl, vlv1, vrv1, v0v1;

  // build loop from halfedge v1->vl
  if (vl.is_valid())
  {
    v1vl = find_halfedge(v1, vl);
    assert(v1vl.is_valid());
    vlv1 = insert_loop(v1vl);
  }

  // build loop from halfedge vr->v1
  if (vr.is_valid())
  {
    vrv1 = find_halfedge(vr, v1);
    assert(vrv1.is_valid());
    insert_loop(vrv1);
  }

  // handle boundary cases
  if (!vl.is_valid())
    vlv1 = prev_halfedge_handle(halfedge_handle(v1));
  if (!vr.is_valid())
    vrv1 = prev_halfedge_handle(halfedge_handle(v1));


  // split vertex v1 into edge v0v1
  v0v1 = insert_edge(v0, vlv1, vrv1);


  return v0v1;
}